

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O2

word Mpm_CutTruthFromDsd(Mpm_Man_t *pMan,Mpm_Cut_t *pCut,int iClass)

{
  uint uVar1;
  int iVar2;
  word Truth;
  ulong uVar3;
  
  uVar1 = *(uint *)&pCut->field_0x4;
  if (pMan->pDsd6[iClass].nVars == uVar1 >> 0x1b) {
    Truth = pMan->pDsd6[iClass].uTruth;
    for (uVar3 = 0; uVar3 < uVar1 >> 0x1b; uVar3 = uVar3 + 1) {
      iVar2 = Abc_LitIsCompl(pCut->pLeaves[uVar3]);
      if (iVar2 != 0) {
        Truth = Abc_Tt6Flip(Truth,(int)uVar3);
      }
      uVar1 = *(uint *)&pCut->field_0x4;
    }
    return Truth;
  }
  __assert_fail("pMan->pDsd6[iClass].nVars == (int)pCut->nLeaves",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mpm/mpmDsd.c"
                ,0x377,"word Mpm_CutTruthFromDsd(Mpm_Man_t *, Mpm_Cut_t *, int)");
}

Assistant:

word Mpm_CutTruthFromDsd( Mpm_Man_t * pMan, Mpm_Cut_t * pCut, int iClass )
{
    int i;
    word uTruth = pMan->pDsd6[iClass].uTruth;
    assert( pMan->pDsd6[iClass].nVars == (int)pCut->nLeaves );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        if ( Abc_LitIsCompl(pCut->pLeaves[i]) )
            uTruth = Abc_Tt6Flip( uTruth, i ); 
    return uTruth;
}